

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  FILE *__stream;
  size_t sVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  wasm_frame_t *frame;
  int iVar9;
  char *pcVar10;
  bool bVar11;
  size_t i;
  ulong uVar12;
  wasm_valtype_t *rs [1];
  wasm_valtype_vec_t results;
  wasm_extern_vec_t exports;
  wasm_byte_vec_t binary;
  wasm_extern_t *imports [1];
  ulong local_78;
  long local_70;
  undefined1 local_68 [8];
  undefined8 local_60;
  ulong local_58;
  long local_50;
  undefined1 local_48 [8];
  void *local_40;
  undefined8 local_38;
  
  puts("Initializing...");
  uVar2 = wasm_engine_new();
  uVar3 = wasm_store_new(uVar2);
  puts("Loading binary...");
  __stream = fopen("trap.wasm","r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar4 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(local_48,sVar4);
    sVar4 = fread(local_40,sVar4,1,__stream);
    if (sVar4 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar5 = wasm_module_new(uVar3,local_48);
      if (lVar5 == 0) {
        pcVar10 = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(local_48);
        puts("Creating callback...");
        local_78 = wasm_valtype_new(0);
        wasm_valtype_vec_new_empty(&local_58);
        wasm_valtype_vec_new(local_68,1,&local_78);
        uVar6 = wasm_functype_new(&local_58,local_68);
        uVar7 = wasm_func_new_with_env(uVar3,uVar6,fail_callback,uVar3,0);
        wasm_functype_delete(uVar6);
        puts("Instantiating module...");
        local_38 = wasm_func_as_extern(uVar7);
        lVar8 = wasm_instance_new(uVar3,lVar5,&local_38,0);
        if (lVar8 != 0) {
          wasm_func_delete(uVar7);
          puts("Extracting exports...");
          wasm_instance_exports(lVar8,&local_58);
          iVar9 = 1;
          if (local_58 < 2) {
            pcVar10 = "> Error accessing exports!";
          }
          else {
            wasm_module_delete(lVar5);
            wasm_instance_delete(lVar8);
            lVar5 = 0;
            bVar1 = true;
            do {
              bVar11 = bVar1;
              lVar8 = wasm_extern_as_func(*(undefined8 *)(local_50 + lVar5 * 8));
              if (lVar8 == 0) {
                pcVar10 = "> Error accessing export!";
                goto LAB_001027c7;
              }
              printf("Calling export %d...\n",lVar5);
              lVar5 = wasm_func_call(lVar8,0,0);
              if (lVar5 == 0) {
                pcVar10 = "> Error calling function, expected trap!";
                goto LAB_001027c7;
              }
              puts("Printing message...");
              wasm_trap_message(lVar5,local_68);
              printf("> %s\n",local_60);
              puts("Printing origin...");
              frame = (wasm_frame_t *)wasm_trap_origin(lVar5);
              if (frame == (wasm_frame_t *)0x0) {
                puts("> Empty origin.");
              }
              else {
                print_frame(frame);
                wasm_frame_delete(frame);
              }
              puts("Printing trace...");
              wasm_trap_trace(lVar5,&local_78);
              if (local_78 == 0) {
                puts("> Empty trace.");
              }
              else {
                uVar12 = 0;
                do {
                  print_frame(*(wasm_frame_t **)(local_70 + uVar12 * 8));
                  uVar12 = uVar12 + 1;
                } while (uVar12 < local_78);
              }
              wasm_frame_vec_delete(&local_78);
              wasm_trap_delete(lVar5);
              wasm_byte_vec_delete(local_68);
              lVar5 = 1;
              bVar1 = false;
            } while (bVar11);
            wasm_extern_vec_delete(&local_58);
            puts("Shutting down...");
            wasm_store_delete(uVar3);
            wasm_engine_delete(uVar2);
            pcVar10 = "Done.";
            iVar9 = 0;
          }
LAB_001027c7:
          puts(pcVar10);
          return iVar9;
        }
        pcVar10 = "> Error instantiating module!";
      }
      goto LAB_00102624;
    }
  }
  pcVar10 = "> Error loading module!";
LAB_00102624:
  puts(pcVar10);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("trap.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external print functions.
  printf("Creating callback...\n");
  own wasm_functype_t* fail_type =
    wasm_functype_new_0_1(wasm_valtype_new_i32());
  own wasm_func_t* fail_func =
    wasm_func_new_with_env(store, fail_type, fail_callback, store, NULL);

  wasm_functype_delete(fail_type);

  // Instantiate.
  printf("Instantiating module...\n");
  const wasm_extern_t* imports[] = { wasm_func_as_extern(fail_func) };
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(fail_func);

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size < 2) {
    printf("> Error accessing exports!\n");
    return 1;
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);

  // Call.
  for (int i = 0; i < 2; ++i) {
    const wasm_func_t* func = wasm_extern_as_func(exports.data[i]);
    if (func == NULL) {
      printf("> Error accessing export!\n");
      return 1;
    }

    printf("Calling export %d...\n", i);
    own wasm_trap_t* trap = wasm_func_call(func, NULL, NULL);
    if (!trap) {
      printf("> Error calling function, expected trap!\n");
      return 1;
    }

    printf("Printing message...\n");
    own wasm_name_t message;
    wasm_trap_message(trap, &message);
    printf("> %s\n", message.data);

    printf("Printing origin...\n");
    own wasm_frame_t* frame = wasm_trap_origin(trap);
    if (frame) {
      print_frame(frame);
      wasm_frame_delete(frame);
    } else {
      printf("> Empty origin.\n");
    }

    printf("Printing trace...\n");
    own wasm_frame_vec_t trace;
    wasm_trap_trace(trap, &trace);
    if (trace.size > 0) {
      for (size_t i = 0; i < trace.size; ++i) {
        print_frame(trace.data[i]);
      }
    } else {
      printf("> Empty trace.\n");
    }

    wasm_frame_vec_delete(&trace);
    wasm_trap_delete(trap);
    wasm_name_delete(&message);
  }

  wasm_extern_vec_delete(&exports);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}